

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::resolveSubstitution
          (HighsCliqueTable *this,HighsInt *col,double *val,double *offset)

{
  CliqueVar CVar1;
  pointer piVar2;
  pointer pSVar3;
  uint uVar4;
  long lVar5;
  
  piVar2 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->substitutions).
           super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *col;
  while (lVar5 = (long)piVar2[(int)uVar4], lVar5 != 0) {
    CVar1 = pSVar3[lVar5 + -1].replace;
    if (-1 < (int)CVar1) {
      *offset = *val + *offset;
      *val = -*val;
    }
    uVar4 = (uint)CVar1 & 0x7fffffff;
    *col = uVar4;
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(HighsInt& col, double& val,
                                           double& offset) const {
  while (colsubstituted[col]) {
    Substitution subst = substitutions[colsubstituted[col] - 1];
    if (subst.replace.val == 0) {
      offset += val;
      val = -val;
    }
    col = subst.replace.col;
  }
}